

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

IfTagCase * __thiscall
Qentem::Array<Qentem::Tags::IfTagCase>::allocate(Array<Qentem::Tags::IfTagCase> *this)

{
  SizeT size;
  IfTagCase *ptr;
  IfTagCase *new_storage;
  Array<Qentem::Tags::IfTagCase> *this_local;
  
  size = Capacity(this);
  ptr = Memory::Allocate<Qentem::Tags::IfTagCase>(size);
  setStorage(this,ptr);
  return ptr;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }